

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata256.cpp
# Opt level: O0

void __thiscall ByteData256_HexConstructor_Test::TestBody(ByteData256_HexConstructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  char *in_R9;
  AssertHelper local_1d8;
  Message local_1d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1b0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_2;
  Message local_180 [2];
  ByteData local_170;
  undefined1 local_158 [8];
  ByteData byte_class_data;
  Message local_138;
  ByteData local_130;
  string local_118;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_c8;
  Message local_c0;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  Message local_98;
  string local_90;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  ByteData256 byte_data;
  allocator local_31;
  undefined1 local_30 [8];
  string target;
  ByteData256_HexConstructor_Test *this_local;
  
  target.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,"1234567890123456789012345678901234567890123456789012345678901234",
             &local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&gtest_ar.message_,(string *)local_30);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_90,(ByteData256 *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_70,"byte_data.GetHex().c_str()","target.c_str()",pcVar2,rhs);
  std::__cxx11::string::~string((string *)&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata256.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  bVar1 = cfd::core::ByteData256::IsEmpty((ByteData256 *)&gtest_ar.message_);
  local_b1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_b0,
               (AssertionResult *)"byte_data.IsEmpty()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata256.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  cfd::core::ByteData256::Serialize(&local_130,(ByteData256 *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_118,&local_130);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_f8,"byte_data.Serialize().GetHex().c_str()",
             "\"201234567890123456789012345678901234567890123456789012345678901234\"",pcVar2,
             "201234567890123456789012345678901234567890123456789012345678901234");
  std::__cxx11::string::~string((string *)&local_118);
  cfd::core::ByteData::~ByteData(&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &byte_class_data.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata256.cpp"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &byte_class_data.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_138);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &byte_class_data.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  cfd::core::ByteData::ByteData((ByteData *)local_158);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ByteData256::GetData(&local_170,(ByteData256 *)&gtest_ar.message_);
      cfd::core::ByteData::operator=((ByteData *)local_158,&local_170);
      cfd::core::ByteData::~ByteData(&local_170);
    }
  }
  else {
    testing::Message::Message(local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata256.cpp"
               ,0x30,
               "Expected: byte_class_data = byte_data.GetData() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_180);
  }
  cfd::core::ByteData256::GetBytes(&local_1b0,(ByteData256 *)&gtest_ar.message_);
  cfd::core::ByteData::GetBytes(&local_1c8,(ByteData *)local_158);
  testing::internal::EqHelper<false>::
  Compare<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((EqHelper<false> *)local_198,"byte_data.GetBytes()","byte_class_data.GetBytes()",
             &local_1b0,&local_1c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata256.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  cfd::core::ByteData::~ByteData((ByteData *)local_158);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(ByteData256, HexConstructor) {
  std::string target(
      "1234567890123456789012345678901234567890123456789012345678901234");
  ByteData256 byte_data = ByteData256(target);

  EXPECT_STREQ(byte_data.GetHex().c_str(), target.c_str());
  EXPECT_FALSE(byte_data.IsEmpty());
  EXPECT_STREQ(
    byte_data.Serialize().GetHex().c_str(),
    "201234567890123456789012345678901234567890123456789012345678901234");
  ByteData byte_class_data;
  EXPECT_NO_THROW(byte_class_data = byte_data.GetData());
  EXPECT_EQ(byte_data.GetBytes(), byte_class_data.GetBytes());
}